

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

void LzmaEnc_SaveState(CLzmaEncHandle pp)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  undefined4 *puVar12;
  undefined4 *puVar13;
  byte bVar14;
  
  bVar14 = 0;
  memcpy((void *)((long)pp + 0x3d9c8),(void *)((long)pp + 0x342b8),0x4848);
  memcpy((void *)((long)pp + 0x42210),(void *)((long)pp + 0x38b00),0x4848);
  *(undefined4 *)((long)pp + 0x3d350) = *(undefined4 *)((long)pp + 0x5c);
  lVar10 = -0x180;
  do {
    puVar1 = (undefined8 *)((long)pp + lVar10 + 0x33dd4);
    uVar3 = *puVar1;
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)((long)pp + lVar10 + 0x33de4);
    uVar5 = puVar2[1];
    puVar1 = (undefined8 *)((long)pp + lVar10 + 0x33fb4);
    uVar6 = *puVar1;
    uVar7 = puVar1[1];
    puVar1 = (undefined8 *)((long)pp + lVar10 + 0x33fc4);
    uVar8 = *puVar1;
    uVar9 = puVar1[1];
    puVar1 = (undefined8 *)((long)pp + lVar10 + 0x3d4f4);
    *puVar1 = *puVar2;
    puVar1[1] = uVar5;
    puVar1 = (undefined8 *)((long)pp + lVar10 + 0x3d4e4);
    *puVar1 = uVar3;
    puVar1[1] = uVar4;
    puVar1 = (undefined8 *)((long)pp + lVar10 + 0x3d6c4);
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
    puVar1 = (undefined8 *)((long)pp + lVar10 + 0x3d6d4);
    *puVar1 = uVar8;
    puVar1[1] = uVar9;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0);
  lVar10 = 0;
  do {
    puVar12 = (undefined4 *)((long)pp + lVar10 + 0x33fb4);
    puVar13 = (undefined4 *)((long)pp + lVar10 + 0x3d6c4);
    for (lVar11 = 0x20; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar13 = *puVar12;
      puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
      puVar13 = puVar13 + (ulong)bVar14 * -2 + 1;
    }
    lVar10 = lVar10 + 0x80;
  } while (lVar10 != 0x200);
  *(undefined8 *)((long)pp + 0x3d4f4) = *(undefined8 *)((long)pp + 0x33de4);
  *(undefined8 *)((long)pp + 0x3d4e4) = *(undefined8 *)((long)pp + 0x33dd4);
  *(undefined8 *)((long)pp + 0x3d4ec) = *(undefined8 *)((long)pp + 0x33ddc);
  *(undefined8 *)((long)pp + 0x3d4fc) = *(undefined8 *)((long)pp + 0x33dec);
  *(undefined8 *)((long)pp + 0x3d504) = *(undefined8 *)((long)pp + 0x33df4);
  *(undefined8 *)((long)pp + 0x3d50c) = *(undefined8 *)((long)pp + 0x33dfc);
  *(undefined8 *)((long)pp + 0x3d514) = *(undefined8 *)((long)pp + 0x33e04);
  *(undefined8 *)((long)pp + 0x3d51c) = *(undefined8 *)((long)pp + 0x33e0c);
  *(undefined8 *)((long)pp + 0x3d524) = *(undefined8 *)((long)pp + 0x33e14);
  *(undefined8 *)((long)pp + 0x3d52c) = *(undefined8 *)((long)pp + 0x33e1c);
  *(undefined8 *)((long)pp + 0x3d534) = *(undefined8 *)((long)pp + 0x33e24);
  *(undefined8 *)((long)pp + 0x3d53c) = *(undefined8 *)((long)pp + 0x33e2c);
  memcpy((void *)((long)pp + 0x3d8c4),(void *)((long)pp + 0x341b4),0xe4);
  *(undefined8 *)((long)pp + 0x3d9a8) = *(undefined8 *)((long)pp + 0x34298);
  *(undefined8 *)((long)pp + 0x3d9b0) = *(undefined8 *)((long)pp + 0x342a0);
  *(undefined8 *)((long)pp + 0x3d9b8) = *(undefined8 *)((long)pp + 0x342a8);
  *(undefined8 *)((long)pp + 0x3d9c0) = *(undefined8 *)((long)pp + 0x342b0);
  *(undefined8 *)((long)pp + 0x3d354) = *(undefined8 *)((long)pp + 0x4c);
  *(undefined8 *)((long)pp + 0x3d35c) = *(undefined8 *)((long)pp + 0x54);
  memcpy(*(void **)((long)pp + 0x3d348),*(void **)((long)pp + 0x78),
         (ulong)(uint)(0x300 << (*(byte *)((long)pp + 0x74) & 0x1f)) * 2);
  return;
}

Assistant:

void LzmaEnc_SaveState(CLzmaEncHandle pp)
{
  CLzmaEnc *p = (CLzmaEnc *)pp;
  CSaveState *dest = &p->saveState;
  int i;
  dest->lenEnc = p->lenEnc;
  dest->repLenEnc = p->repLenEnc;
  dest->state = p->state;

  for (i = 0; i < kNumStates; i++)
  {
    memcpy(dest->isMatch[i], p->isMatch[i], sizeof(p->isMatch[i]));
    memcpy(dest->isRep0Long[i], p->isRep0Long[i], sizeof(p->isRep0Long[i]));
  }
  for (i = 0; i < kNumLenToPosStates; i++)
    memcpy(dest->posSlotEncoder[i], p->posSlotEncoder[i], sizeof(p->posSlotEncoder[i]));
  memcpy(dest->isRep, p->isRep, sizeof(p->isRep));
  memcpy(dest->isRepG0, p->isRepG0, sizeof(p->isRepG0));
  memcpy(dest->isRepG1, p->isRepG1, sizeof(p->isRepG1));
  memcpy(dest->isRepG2, p->isRepG2, sizeof(p->isRepG2));
  memcpy(dest->posEncoders, p->posEncoders, sizeof(p->posEncoders));
  memcpy(dest->posAlignEncoder, p->posAlignEncoder, sizeof(p->posAlignEncoder));
  memcpy(dest->reps, p->reps, sizeof(p->reps));
  memcpy(dest->litProbs, p->litProbs, ((UInt32)0x300 << p->lclp) * sizeof(CLzmaProb));
}